

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_close_comp(int handle)

{
  int iVar1;
  int in_EDI;
  size_t compsize;
  int status;
  int *in_stack_00000098;
  size_t *in_stack_000000a0;
  FILE *in_stack_000000a8;
  size_t in_stack_000000b0;
  char *in_stack_000000b8;
  int local_8;
  
  local_8 = 0;
  iVar1 = compress2file_from_mem
                    (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                     in_stack_00000098);
  if (iVar1 != 0) {
    ffpmsg((char *)0x11fe35);
    local_8 = 0x6a;
  }
  free(memTable[in_EDI].memaddr);
  memTable[in_EDI].memaddrptr = (char **)0x0;
  memTable[in_EDI].memaddr = (char *)0x0;
  if (memTable[in_EDI].fileptr != _stdout) {
    fclose((FILE *)memTable[in_EDI].fileptr);
  }
  return local_8;
}

Assistant:

int mem_close_comp(int handle)
/*
  compress the memory file, writing it out to the fileptr (which might
  be stdout)
*/
{
    int status = 0;
    size_t compsize;

    /* compress file in  memory to a .gz disk file */

    if(compress2file_from_mem(memTable[handle].memaddr,
              (size_t) (memTable[handle].fitsfilesize), 
              memTable[handle].fileptr,
              &compsize, &status ) )
    {
            ffpmsg("failed to copy memory file to file (mem_close_comp)");
            status = WRITE_ERROR;
    }

    free( memTable[handle].memaddr );   /* free the memory */
    memTable[handle].memaddrptr = 0;
    memTable[handle].memaddr = 0;

    /* close the compressed disk file (except if it is 'stdout' */
    if (memTable[handle].fileptr != stdout)
        fclose(memTable[handle].fileptr);

    return(status);
}